

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.hpp
# Opt level: O0

unsigned_long
mxx::exscan<unsigned_long,std::plus<unsigned_long>>(undefined8 x,comm *param_2,byte param_3)

{
  unsigned_long uVar1;
  int iVar2;
  MPI_Datatype poVar3;
  MPI_Op poVar4;
  MPI_Comm poVar5;
  unsigned_long local_78;
  unsigned_long result;
  undefined1 local_68 [8];
  custom_op<unsigned_long> op;
  bool commutative_local;
  comm *comm_local;
  unsigned_long *x_local;
  
  op.m_op._7_1_ = param_3 & 1;
  custom_op<unsigned_long>::custom_op<std::plus<unsigned_long>>
            ((custom_op<unsigned_long> *)local_68,op.m_op._7_1_);
  poVar3 = custom_op<unsigned_long>::get_type((custom_op<unsigned_long> *)local_68);
  poVar4 = custom_op<unsigned_long>::get_op((custom_op<unsigned_long> *)local_68);
  poVar5 = comm::operator_cast_to_ompi_communicator_t_(param_2);
  MPI_Exscan(x,&local_78,1,poVar3,poVar4,poVar5);
  iVar2 = comm::rank(param_2);
  if (iVar2 == 0) {
    local_78 = 0;
  }
  uVar1 = local_78;
  custom_op<unsigned_long>::~custom_op((custom_op<unsigned_long> *)local_68);
  return uVar1;
}

Assistant:

T exscan(const T& x, Func func, const mxx::comm& comm = mxx::comm(), const bool commutative = true) {
    // get op
    mxx::custom_op<T> op(std::forward<Func>(func), commutative);
    // perform reduction
    T result;
    MPI_Exscan(const_cast<T*>(&x), &result, 1, op.get_type(), op.get_op(), comm);
    if (comm.rank() == 0)
      result = T();
    return result;
}